

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# partial_sum_max.hpp
# Opt level: O0

pair<std::ostream_iterator<int,_char,_std::char_traits<char>_>,_int> * __thiscall
burst::
partial_sum_max<std::istream_iterator<int,char,std::char_traits<char>,long>,std::ostream_iterator<int,char,std::char_traits<char>>,std::plus<void>,std::less<void>>
          (pair<std::ostream_iterator<int,_char,_std::char_traits<char>_>,_int>
           *__return_storage_ptr__,burst *this,
          istream_iterator<int,_char,_std::char_traits<char>,_long> *first,
          ostream_iterator<int,_char,_std::char_traits<char>_> *last)

{
  bool bVar1;
  int *piVar2;
  ostream_iterator<int,_char,_std::char_traits<char>_> *poVar3;
  istream_iterator<int,_char,_std::char_traits<char>,_long> *__x;
  int local_44;
  int local_40;
  int local_3c;
  int new_sum;
  int current;
  int max;
  int sum;
  ostream_iterator<int,_char,_std::char_traits<char>_> *result_local;
  istream_iterator<int,_char,_std::char_traits<char>,_long> *last_local;
  istream_iterator<int,_char,_std::char_traits<char>,_long> *first_local;
  pair<std::ostream_iterator<int,_char,_std::char_traits<char>_>,_int> *local_10;
  
  _max = last;
  result_local = (ostream_iterator<int,_char,_std::char_traits<char>_> *)first;
  last_local = (istream_iterator<int,_char,_std::char_traits<char>,_long> *)this;
  local_10 = __return_storage_ptr__;
  bVar1 = std::operator!=((istream_iterator<int,_char,_std::char_traits<char>,_long> *)this,first);
  if (bVar1) {
    piVar2 = std::istream_iterator<int,_char,_std::char_traits<char>,_long>::operator*
                       ((istream_iterator<int,_char,_std::char_traits<char>,_long> *)this);
    new_sum = *piVar2;
    current = new_sum;
    poVar3 = std::ostream_iterator<int,_char,_std::char_traits<char>_>::operator*(last);
    std::ostream_iterator<int,_char,_std::char_traits<char>_>::operator=(poVar3,&current);
    while( true ) {
      __x = std::istream_iterator<int,_char,_std::char_traits<char>,_long>::operator++
                      ((istream_iterator<int,_char,_std::char_traits<char>,_long> *)this);
      bVar1 = std::operator!=(__x,first);
      if (!bVar1) break;
      piVar2 = std::istream_iterator<int,_char,_std::char_traits<char>,_long>::operator*
                         ((istream_iterator<int,_char,_std::char_traits<char>,_long> *)this);
      local_3c = *piVar2;
      bVar1 = (((std::forward<int&>)({parm#1}))<((std::forward<int&>)({parm#2})))std::less<void>::
              operator()((void *)((long)&first_local + 6),&new_sum,&local_3c);
      if (bVar1) {
        new_sum = local_3c;
      }
      local_40 = std::plus<void>::operator()
                           ((plus<void> *)((long)&first_local + 7),&current,&local_3c);
      current = local_40;
      std::ostream_iterator<int,_char,_std::char_traits<char>_>::operator++(last);
      poVar3 = std::ostream_iterator<int,_char,_std::char_traits<char>_>::operator*(last);
      std::ostream_iterator<int,_char,_std::char_traits<char>_>::operator=(poVar3,&current);
    }
    poVar3 = std::ostream_iterator<int,_char,_std::char_traits<char>_>::operator++(last);
    std::pair<std::ostream_iterator<int,_char,_std::char_traits<char>_>,_int>::
    pair<std::ostream_iterator<int,_char,_std::char_traits<char>_>_&,_int_&,_true>
              (__return_storage_ptr__,poVar3,&new_sum);
  }
  else {
    local_44 = 0;
    std::pair<std::ostream_iterator<int,_char,_std::char_traits<char>_>,_int>::
    pair<std::ostream_iterator<int,_char,_std::char_traits<char>_>_&,_int,_true>
              (__return_storage_ptr__,last,&local_44);
  }
  return __return_storage_ptr__;
}

Assistant:

std::pair<OutputIterator, iterator_value_t<InputIterator>>
        partial_sum_max
        (
            InputIterator first,
            InputIterator last,
            OutputIterator result,
            BinaryFunction plus,
            BinaryPredicate less
        )
    {
        if (first != last)
        {
            auto sum = *first;
            auto max = sum;

            *result = sum;

            while (++first != last)
            {
                auto current = *first;
                if (less(max, current))
                {
                    max = current;
                }

                auto new_sum = plus(std::move(sum), std::move(current));
                sum = std::move(new_sum);

                ++result;
                *result = sum;
            }

            return {++result, max};
        }

        return {result, iterator_value_t<InputIterator>{}};
    }